

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

nvar_extended_attributes_t * __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_attributes(nvar_entry_body_t *this)

{
  kstream *pkVar1;
  bool bVar2;
  uint16_t uVar3;
  nvar_entry_t *pnVar4;
  nvar_attributes_t *pnVar5;
  uint64_t uVar6;
  kstream *this_00;
  nvar_extended_attributes_t *this_01;
  unique_ptr<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
  local_30;
  undefined1 local_28 [8];
  streampos _pos;
  nvar_entry_body_t *this_local;
  
  _pos._M_state = (__mbstate_t)this;
  if ((this->f_extended_header_attributes & 1U) == 0) {
    this->n_extended_header_attributes = true;
    pnVar4 = _parent(this);
    pnVar5 = nvar_entry_t::attributes(pnVar4);
    bVar2 = nvar_attributes_t::valid(pnVar5);
    if (bVar2) {
      pnVar4 = _parent(this);
      pnVar5 = nvar_entry_t::attributes(pnVar4);
      bVar2 = nvar_attributes_t::extended_header(pnVar5);
      if ((bVar2) && (uVar3 = extended_header_size(this), 2 < uVar3)) {
        this->n_extended_header_attributes = false;
        uVar6 = kaitai::kstream::pos((this->super_kstruct).m__io);
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)local_28,uVar6);
        pkVar1 = (this->super_kstruct).m__io;
        this_00 = kaitai::kstruct::_io(&this->super_kstruct);
        uVar6 = kaitai::kstream::pos(this_00);
        uVar3 = extended_header_size(this);
        kaitai::kstream::seek(pkVar1,uVar6 - uVar3);
        this_01 = (nvar_extended_attributes_t *)operator_new(0x40);
        nvar_extended_attributes_t::nvar_extended_attributes_t
                  (this_01,(this->super_kstruct).m__io,this,this->m__root);
        std::
        unique_ptr<ami_nvar_t::nvar_extended_attributes_t,std::default_delete<ami_nvar_t::nvar_extended_attributes_t>>
        ::unique_ptr<std::default_delete<ami_nvar_t::nvar_extended_attributes_t>,void>
                  ((unique_ptr<ami_nvar_t::nvar_extended_attributes_t,std::default_delete<ami_nvar_t::nvar_extended_attributes_t>>
                    *)&local_30,this_01);
        std::
        unique_ptr<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
        ::operator=(&this->m_extended_header_attributes,&local_30);
        std::
        unique_ptr<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
        ::~unique_ptr(&local_30);
        pkVar1 = (this->super_kstruct).m__io;
        uVar6 = std::fpos::operator_cast_to_long((fpos *)local_28);
        kaitai::kstream::seek(pkVar1,uVar6);
        this->f_extended_header_attributes = true;
      }
    }
    this_local = (nvar_entry_body_t *)
                 std::
                 unique_ptr<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
                 ::get(&this->m_extended_header_attributes);
  }
  else {
    this_local = (nvar_entry_body_t *)
                 std::
                 unique_ptr<ami_nvar_t::nvar_extended_attributes_t,_std::default_delete<ami_nvar_t::nvar_extended_attributes_t>_>
                 ::get(&this->m_extended_header_attributes);
  }
  return (nvar_extended_attributes_t *)this_local;
}

Assistant:

ami_nvar_t::nvar_extended_attributes_t* ami_nvar_t::nvar_entry_body_t::extended_header_attributes() {
    if (f_extended_header_attributes)
        return m_extended_header_attributes.get();
    n_extended_header_attributes = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (extended_header_size() >= (1 + 2))) ) {
        n_extended_header_attributes = false;
        std::streampos _pos = m__io->pos();
        m__io->seek((_io()->pos() - extended_header_size()));
        m_extended_header_attributes = std::unique_ptr<nvar_extended_attributes_t>(new nvar_extended_attributes_t(m__io, this, m__root));
        m__io->seek(_pos);
        f_extended_header_attributes = true;
    }
    return m_extended_header_attributes.get();
}